

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRFakeHandTrackerDevice.cpp
# Opt level: O3

void __thiscall
MinVR::VRFakeHandTrackerDevice::appendNewInputEventsSinceLastCall
          (VRFakeHandTrackerDevice *this,VRDataQueue *inputEvents)

{
  _Rb_tree<std::pair<long_long,_int>,_std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>,_std::_Select1st<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
  _Stack_48;
  
  std::
  _Rb_tree<std::pair<long_long,_int>,_std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>,_std::_Select1st<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
  ::_Rb_tree(&_Stack_48,
             (_Rb_tree<std::pair<long_long,_int>,_std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>,_std::_Select1st<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
              *)&this->_pendingEvents);
  VRDataQueue::addQueue(inputEvents,(VRDataQueue *)&_Stack_48);
  std::
  _Rb_tree<std::pair<long_long,_int>,_std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>,_std::_Select1st<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>,_std::less<std::pair<long_long,_int>_>,_std::allocator<std::pair<const_std::pair<long_long,_int>,_MinVR::VRDataQueueItem>_>_>
  ::~_Rb_tree(&_Stack_48);
  VRDataQueue::clear(&this->_pendingEvents);
  return;
}

Assistant:

void VRFakeHandTrackerDevice::appendNewInputEventsSinceLastCall(VRDataQueue* inputEvents)
{
    inputEvents->addQueue(_pendingEvents);
    _pendingEvents.clear();
}